

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::render
          (FlushFinishCase *this,int numDrawCalls)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  int local_2c;
  undefined1 auStack_26 [2];
  int ndx;
  long lStack_20;
  deUint8 indices [6];
  Functions *gl;
  int numDrawCalls_local;
  FlushFinishCase *this_local;
  
  pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  _auStack_26 = 0x2020100;
  ndx._2_2_ = 0x301;
  (**(code **)(lStack_20 + 0x188))(0x4500);
  for (local_2c = 0; local_2c < numDrawCalls; local_2c = local_2c + 1) {
    (**(code **)(lStack_20 + 0x568))(4,6,0x1401,auStack_26);
  }
  return;
}

Assistant:

void FlushFinishCase::render (int numDrawCalls)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	for (int ndx = 0; ndx < numDrawCalls; ndx++)
		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_BYTE, &indices[0]);
}